

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall
QL_Manager::RunUpdate
          (QL_Manager *this,QL_Node *topNode,RelAttr *updAttr,int bIsValue,RelAttr *rhsRelAttr,
          Value *rhsValue)

{
  AttrCatEntry *pAVar1;
  RelAttr *pRVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar4;
  int extraout_EAX_01;
  int extraout_EAX_02;
  DataAttrInfo *attributes;
  size_t sVar5;
  long lVar6;
  QL_Manager *pQVar7;
  char *pcVar8;
  char *__dest;
  IX_IndexHandle ih;
  char *pData;
  RID rid;
  int attrListSize;
  int index2;
  int index1;
  int finalTupLength;
  RM_Record rec;
  Printer printer;
  int *attrList;
  RM_FileHandle relFH;
  IX_Manager local_101;
  char *local_100;
  QL_Manager *local_f8;
  int local_f0;
  RID local_ec;
  int local_e4;
  RelAttr *local_e0;
  int local_d8;
  int local_d4;
  DataAttrInfo *local_d0;
  int local_c4;
  RM_Record local_c0;
  Printer local_a8;
  int *local_80;
  RM_FileHandle local_78;
  
  QL_Node::GetTupleLength(topNode,&local_c4);
  iVar3 = QL_Node::GetAttrList(topNode,&local_80,&local_e4);
  if (iVar3 == 0) {
    local_f0 = bIsValue;
    local_e0 = updAttr;
    attributes = (DataAttrInfo *)malloc((long)local_e4 * 0x44);
    iVar3 = SetUpPrinter(this,topNode,attributes);
    if (iVar3 == 0) {
      local_f8 = this;
      local_d0 = attributes;
      Printer::Printer(&local_a8,attributes,local_e4);
      Printer::PrintHeader(&local_a8,(ostream *)&std::cout);
      RM_FileHandle::RM_FileHandle(&local_78);
      iVar3 = RM_Manager::OpenFile(local_f8->rmm,local_f8->relEntries->relName,&local_78);
      if (((iVar3 == 0) && (iVar3 = GetAttrCatEntryPos(local_f8,*local_e0,&local_d4), iVar3 == 0))
         && ((local_f0 != 0 ||
             (iVar3 = GetAttrCatEntryPos(local_f8,*rhsRelAttr,&local_d8), iVar3 == 0)))) {
        IX_Manager::DestroyIndex(&local_101);
        pQVar7 = local_f8;
        lVar6 = (long)local_d4;
        if (((local_f8->attrEntries[lVar6].indexNo == -1) ||
            (IX_Manager::DestroyIndex(local_f8->ixm), iVar3 = extraout_EAX, extraout_EAX == 0)) &&
           (iVar3 = (**topNode->_vptr_QL_Node)(topNode), iVar3 == 0)) {
          RM_Record::RM_Record(&local_c0);
          RID::RID(&local_ec);
          local_e0 = (RelAttr *)((long)local_d8 * 0x54);
          do {
            iVar3 = (*topNode->_vptr_QL_Node[2])(topNode,&local_c0);
            if (iVar3 != 0) {
              if (((iVar3 == 0x199) && (iVar3 = (*topNode->_vptr_QL_Node[3])(topNode), iVar3 == 0))
                 && (((pQVar7->attrEntries[lVar6].indexNo == -1 ||
                      (IX_Manager::DestroyIndex(pQVar7->ixm), iVar3 = extraout_EAX_02,
                      extraout_EAX_02 == 0)) &&
                     (iVar3 = RM_Manager::CloseFile(pQVar7->rmm,&local_78), iVar3 == 0)))) {
                Printer::PrintFooter(&local_a8,(ostream *)&std::cout);
                free(local_d0);
                iVar3 = 0;
              }
              goto LAB_0011124b;
            }
            iVar3 = RM_Record::GetRid(&local_c0,&local_ec);
            if ((iVar3 != 0) || (iVar3 = RM_Record::GetData(&local_c0,&local_100), iVar3 != 0))
            goto LAB_0011124b;
            if ((pQVar7->attrEntries[lVar6].indexNo != -1) &&
               (IX_IndexHandle::DeleteEntry((IX_IndexHandle *)&local_101), extraout_EAX_00 != 0))
            break;
            pRVar2 = local_e0;
            pAVar1 = pQVar7->attrEntries;
            if (local_f0 == 0) {
              iVar3 = *(int *)((long)&pAVar1->attrLength + (long)local_e0);
              iVar4 = pAVar1[lVar6].attrLength;
              __dest = local_100 + pAVar1[lVar6].offset;
              pcVar8 = local_100 + *(int *)((long)&pAVar1->offset + (long)local_e0);
              if (iVar4 <= iVar3) goto LAB_001111cc;
              memcpy(__dest,pcVar8,(long)iVar3);
              local_100[(long)*(int *)((long)&pQVar7->attrEntries->attrLength + (long)pRVar2) +
                        (long)pQVar7->attrEntries[lVar6].offset] = '\0';
            }
            else if (pAVar1[lVar6].attrType == STRING) {
              pcVar8 = (char *)rhsValue->data;
              sVar5 = strlen(pcVar8);
              iVar4 = (int)sVar5 + 1;
              iVar3 = pAVar1[lVar6].attrLength;
              if (iVar4 < pAVar1[lVar6].attrLength) {
                iVar3 = iVar4;
              }
              memcpy(local_100 + pAVar1[lVar6].offset,pcVar8,(long)iVar3);
              pQVar7 = local_f8;
            }
            else {
              __dest = local_100 + pAVar1[lVar6].offset;
              pcVar8 = (char *)rhsValue->data;
              iVar4 = pAVar1[lVar6].attrLength;
LAB_001111cc:
              memcpy(__dest,pcVar8,(long)iVar4);
            }
            iVar3 = RM_FileHandle::UpdateRec(&local_78,&local_c0);
            if (iVar3 != 0) goto LAB_0011124b;
            Printer::Print(&local_a8,(ostream *)&std::cout,local_100);
          } while ((pQVar7->attrEntries[lVar6].indexNo == -1) ||
                  (IX_IndexHandle::DeleteEntry((IX_IndexHandle *)&local_101), extraout_EAX_01 == 0))
          ;
          iVar3 = 0;
LAB_0011124b:
          RID::~RID(&local_ec);
          RM_Record::~RM_Record(&local_c0);
        }
        IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&local_101);
      }
      RM_FileHandle::~RM_FileHandle(&local_78);
      Printer::~Printer(&local_a8);
    }
  }
  return iVar3;
}

Assistant:

RC QL_Manager::RunUpdate(QL_Node *topNode, const RelAttr &updAttr,
                      const int bIsValue,
                      const RelAttr &rhsRelAttr,
                      const Value &rhsValue){
  RC rc = 0;
  // Retrieves the attributes in this relation for the printer setup
  int finalTupLength, attrListSize;
  topNode->GetTupleLength(finalTupLength);
  int *attrList;
  if((rc = topNode->GetAttrList(attrList, attrListSize)))
    return (rc);
  DataAttrInfo * attributes = (DataAttrInfo *)malloc(attrListSize* sizeof(DataAttrInfo));
  if((rc = SetUpPrinter(topNode, attributes)))
    return (rc);
  Printer printer(attributes, attrListSize);
  printer.PrintHeader(cout);


  // Open the file
  RM_FileHandle relFH;
  if((rc = rmm.OpenFile(relEntries->relName, relFH)))
    return (rc);

  int index1, index2; // Get the attrEntries indices to the RHS and LHS attributes
  if((rc = GetAttrCatEntryPos(updAttr, index1)))
    return (rc);
  if(!bIsValue){
    if((rc = GetAttrCatEntryPos(rhsRelAttr, index2)))
      return (rc);
  }

  // Get the index to the attribute to be update, if there is one
  IX_IndexHandle ih;
  if((attrEntries[index1].indexNo != -1)){
    if((rc = ixm.OpenIndex(relEntries->relName, attrEntries[index1].indexNo, ih)))
      return (rc);
  }

  // Find all tuples that meet the condition
  if((rc = topNode->OpenIt() ))
    return (rc);
  RM_Record rec;
  RID rid;
  while(true){
    if((rc = topNode->GetNextRec(rec))){
      if (rc == QL_EOI){
        break;
      }
      return (rc);
    }
    char *pData;
    if((rc = rec.GetRid(rid)) || (rc = rec.GetData(pData)) )
      return (rc);
    if(attrEntries[index1].indexNo != -1){ // Delete this value from the index
      if((ih.DeleteEntry(pData + attrEntries[index1].offset, rid)))
        return (rc);
    }
    
    // Set the attribute to its new value
    if(bIsValue){
      if(attrEntries[index1].attrType == STRING){
        int valueLength = strlen((char *)rhsValue.data);
        if(attrEntries[index1].attrLength <= (valueLength + 1) )
          memcpy(pData + attrEntries[index1].offset, (char *)rhsValue.data, attrEntries[index1].attrLength);
        else
          memcpy(pData + attrEntries[index1].offset, (char *)rhsValue.data, valueLength + 1);
      }
      else
        memcpy(pData + attrEntries[index1].offset, (char *)rhsValue.data, attrEntries[index1].attrLength);
    }
    else{
      if(attrEntries[index2].attrLength >= attrEntries[index1].attrLength)
        memcpy(pData + attrEntries[index1].offset, pData + attrEntries[index2].offset, attrEntries[index1].attrLength);
      else{
        memcpy(pData + attrEntries[index1].offset, pData + attrEntries[index2].offset, attrEntries[index2].attrLength);
        pData[attrEntries[index1].offset + attrEntries[index2].attrLength] = '\0';
      }
    }

    // Upate this record in the file
    if((rc = relFH.UpdateRec(rec)))
      return (rc);
    printer.Print(cout, pData);
    
    // Update the record in the index
    if(attrEntries[index1].indexNo != -1){
      if((ih.InsertEntry(pData + attrEntries[index1].offset, rid)))
        return (rc);
    }

  }
  if((rc = topNode->CloseIt()))
    return (rc);
    
  if((attrEntries[index1].indexNo != -1)){ // Close file and indices
    if((rc = ixm.CloseIndex(ih)))
      return (rc);
  }
  if((rc = rmm.CloseFile(relFH)))
    return (rc);

  printer.PrintFooter(cout);
  free(attributes);

  return (0);
}